

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
cmConditionEvaluator::HandleLevel4
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  bool bVar1;
  reference pcVar2;
  bool local_fb;
  bool local_ec;
  bool local_eb;
  bool local_d9;
  _Self local_d0;
  byte local_c3;
  byte local_c2;
  allocator local_c1;
  string local_c0;
  _Self local_a0;
  _Self local_98;
  byte local_8d;
  byte local_7a;
  allocator local_79;
  string local_78;
  _Self local_58;
  _Self local_50;
  _List_iterator<cmExpandedCommandArgument> local_48;
  iterator argP2;
  iterator argP1;
  iterator arg;
  bool rhs;
  bool lhs;
  int reducible;
  MessageType *status_local;
  string *errorString_local;
  cmArgumentList *newArgs_local;
  cmConditionEvaluator *this_local;
  
  do {
    arg._M_node._4_4_ = 0;
    argP1 = std::__cxx11::
            list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::begin
                      (newArgs);
    std::_List_iterator<cmExpandedCommandArgument>::_List_iterator(&argP2);
    std::_List_iterator<cmExpandedCommandArgument>::_List_iterator(&local_48);
    while( true ) {
      local_50._M_node =
           (_List_node_base *)
           std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           ::end(newArgs);
      bVar1 = std::operator!=(&argP1,&local_50);
      if (!bVar1) break;
      argP2 = argP1;
      IncrementArguments(this,newArgs,&argP2,&local_48);
      local_58._M_node =
           (_List_node_base *)
           std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           ::end(newArgs);
      bVar1 = std::operator!=(&argP2,&local_58);
      local_7a = 0;
      local_8d = 0;
      local_d9 = false;
      if (bVar1) {
        std::allocator<char>::allocator();
        local_7a = 1;
        std::__cxx11::string::string((string *)&local_78,"AND",&local_79);
        local_8d = 1;
        pcVar2 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
        bVar1 = IsKeyword(this,&local_78,pcVar2);
        local_d9 = false;
        if (bVar1) {
          local_98._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                         (newArgs);
          local_d9 = std::operator!=(&local_48,&local_98);
        }
      }
      if ((local_8d & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_78);
      }
      if ((local_7a & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_79);
      }
      if (local_d9 != false) {
        pcVar2 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
        arg._M_node._3_1_ = GetBooleanValueWithAutoDereference(this,pcVar2,errorString,status,false)
        ;
        pcVar2 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&local_48);
        arg._M_node._2_1_ = GetBooleanValueWithAutoDereference(this,pcVar2,errorString,status,false)
        ;
        local_eb = false;
        if ((arg._M_node._3_1_ & 1) != 0) {
          local_eb = (bool)arg._M_node._2_1_;
        }
        HandleBinaryOp(this,local_eb,(int *)((long)&arg._M_node + 4),&argP1,newArgs,&argP2,&local_48
                      );
      }
      local_a0._M_node =
           (_List_node_base *)
           std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           ::end(newArgs);
      bVar1 = std::operator!=(&argP2,&local_a0);
      local_c2 = 0;
      local_c3 = 0;
      local_ec = false;
      if (bVar1) {
        std::allocator<char>::allocator();
        local_c2 = 1;
        std::__cxx11::string::string((string *)&local_c0,"OR",&local_c1);
        local_c3 = 1;
        pcVar2 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
        bVar1 = IsKeyword(this,&local_c0,pcVar2);
        local_ec = false;
        if (bVar1) {
          local_d0._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                         (newArgs);
          local_ec = std::operator!=(&local_48,&local_d0);
        }
      }
      if ((local_c3 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_c0);
      }
      if ((local_c2 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      }
      if (local_ec != false) {
        pcVar2 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
        arg._M_node._3_1_ = GetBooleanValueWithAutoDereference(this,pcVar2,errorString,status,false)
        ;
        pcVar2 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&local_48);
        arg._M_node._2_1_ = GetBooleanValueWithAutoDereference(this,pcVar2,errorString,status,false)
        ;
        local_fb = true;
        if ((arg._M_node._3_1_ & 1) == 0) {
          local_fb = (bool)arg._M_node._2_1_;
        }
        HandleBinaryOp(this,local_fb,(int *)((long)&arg._M_node + 4),&argP1,newArgs,&argP2,&local_48
                      );
      }
      std::_List_iterator<cmExpandedCommandArgument>::operator++(&argP1);
    }
  } while (arg._M_node._4_4_ != 0);
  return true;
}

Assistant:

bool cmConditionEvaluator::HandleLevel4(cmArgumentList &newArgs,
                  std::string &errorString,
                  cmake::MessageType &status)
{
  int reducible;
  bool lhs;
  bool rhs;
  do
    {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end())
      {
      argP1 = arg;
      IncrementArguments(newArgs,argP1,argP2);
      if (argP1 != newArgs.end() && IsKeyword("AND", *argP1) &&
        argP2 != newArgs.end())
        {
        lhs = this->GetBooleanValueWithAutoDereference(*arg,
                                                 errorString,
                                                 status);
        rhs = this->GetBooleanValueWithAutoDereference(*argP2,
                                                 errorString,
                                                 status);
        this->HandleBinaryOp((lhs && rhs),
          reducible, arg, newArgs, argP1, argP2);
        }

      if (argP1 != newArgs.end() && this->IsKeyword("OR", *argP1) &&
        argP2 != newArgs.end())
        {
        lhs = this->GetBooleanValueWithAutoDereference(*arg,
                                                 errorString,
                                                 status);
        rhs = this->GetBooleanValueWithAutoDereference(*argP2,
                                                 errorString,
                                                 status);
        this->HandleBinaryOp((lhs || rhs),
          reducible, arg, newArgs, argP1, argP2);
        }
      ++arg;
      }
    }
  while (reducible);
  return true;
}